

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pubsub.cpp
# Opt level: O0

void __thiscall
PubSub_PublishWithNooneListening_Test::PubSub_PublishWithNooneListening_Test
          (PubSub_PublishWithNooneListening_Test *this)

{
  PubSub_PublishWithNooneListening_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__PubSub_PublishWithNooneListening_Test_001e09d0
  ;
  return;
}

Assistant:

TEST (PubSub, PublishWithNooneListening) {
    using testing::_;
    int_message fn;
    EXPECT_CALL (fn, call (_)).Times (0);
    std::condition_variable cv;
    pstore::brokerface::channel<decltype (cv)> chan{&cv};
    chan.publish ([&fn] (int a) { return fn.call (a); }, 7);
}